

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall
cmComputeLinkDepends::cmComputeLinkDepends
          (cmComputeLinkDepends *this,cmGeneratorTarget *target,string *config,string *linkLanguage)

{
  _Rb_tree_header *p_Var1;
  cmGeneratorTarget *pcVar2;
  bool bVar3;
  cmTargetLinkLibraryType cVar4;
  cmMakefile *pcVar5;
  cmLocalGenerator *pcVar6;
  cmValue cVar7;
  cmake *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  cmGlobalGenerator *pcVar8;
  string_view str;
  string_view str_00;
  string_view prefix;
  string_view sep;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  undefined1 local_188 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  overrideList;
  undefined1 local_158 [24];
  cmGlobalGenerator *local_140;
  cmGeneratorExpressionDAGChecker dag;
  string local_b0;
  string local_90;
  string local_70;
  string overrideFeature;
  
  (this->LinkLanguage)._M_dataplus._M_p = (pointer)&(this->LinkLanguage).field_2;
  (this->LinkLanguage)._M_string_length = 0;
  (this->LinkLanguage).field_2._M_local_buf[0] = '\0';
  (this->Config)._M_dataplus._M_p = (pointer)&(this->Config).field_2;
  (this->Config)._M_string_length = 0;
  (this->Config).field_2._M_local_buf[0] = '\0';
  (this->FinalLinkEntries).
  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FinalLinkEntries).
  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FinalLinkEntries).
  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->LinkLibraryOverride)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkLibraryOverride)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkLibraryOverride)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->LinkLibraryOverride)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->LinkLibraryOverride)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LinkEntryIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkEntryIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->LinkEntryIndex)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkLibraryOverride)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->EntryList).
  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->EntryList).
  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->EntryList).
  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LinkEntryIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LinkEntryIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->LinkEntryIndex)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->GroupItems)._M_t._M_impl.super__Rb_tree_header;
  (this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  queue<cmComputeLinkDepends::BFSEntry,std::deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>>
  ::
  queue<std::deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>,void>
            (&this->BFSQueue);
  std::
  queue<cmComputeLinkDepends::SharedDepEntry,std::deque<cmComputeLinkDepends::SharedDepEntry,std::allocator<cmComputeLinkDepends::SharedDepEntry>>>
  ::
  queue<std::deque<cmComputeLinkDepends::SharedDepEntry,std::allocator<cmComputeLinkDepends::SharedDepEntry>>,void>
            (&this->SharedDepQueue);
  p_Var1 = &(this->SharedDepFollowed)._M_t._M_impl.super__Rb_tree_header;
  (this->SharedDepFollowed)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SharedDepFollowed)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->SharedDepFollowed)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SharedDepFollowed)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->PendingComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PendingComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->PendingComponents)._M_t._M_impl.super__Rb_tree_header;
  (this->SharedDepFollowed)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->InferredDependSets).
  super__Vector_base<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->InferredDependSets).
  super__Vector_base<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->InferredDependSets).
  super__Vector_base<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->EntryConstraintGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
  super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->EntryConstraintGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
  super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->EntryConstraintGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
  super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ComponentVisited).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ComponentVisited).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ComponentVisited).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ComponentOrder).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ComponentOrder).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ComponentOrder).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->PendingComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->PendingComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->OldWrongConfigItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->OldWrongConfigItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->OldWrongConfigItems)._M_t._M_impl.super__Rb_tree_header;
  (this->PendingComponents)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->CCG)._M_t.
  super___uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>._M_t
  .super__Tuple_impl<0UL,_cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>.
  super__Head_base<0UL,_cmComputeComponentGraph_*,_false>._M_head_impl =
       (cmComputeComponentGraph *)0x0;
  (this->FinalLinkOrder).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FinalLinkOrder).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FinalLinkOrder).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->OriginalEntries).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OriginalEntries).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OriginalEntries).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->OldWrongConfigItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->OldWrongConfigItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->OldWrongConfigItems)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ObjectEntries).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ObjectEntries).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ObjectEntries).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->Target = target;
  pcVar5 = cmTarget::GetMakefile(target->Target);
  this->Makefile = pcVar5;
  pcVar6 = cmGeneratorTarget::GetLocalGenerator(this->Target);
  pcVar8 = pcVar6->GlobalGenerator;
  this->GlobalGenerator = pcVar8;
  this->CMakeInstance = pcVar8->CMakeInstance;
  std::__cxx11::string::_M_assign((string *)&this->LinkLanguage);
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_158 + 0x10),this->Target);
  for (pcVar8 = (cmGlobalGenerator *)local_158._16_8_; pcVar8 != local_140;
      pcVar8 = (cmGlobalGenerator *)
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&pcVar8->MakeSilentFlag + 1)) {
    str_00._M_str =
         (char *)((cmOutputConverter *)&pcVar8->_vptr_cmGlobalGenerator)->_vptr_cmOutputConverter;
    str_00._M_len = (size_t)((cmStateSnapshot *)&pcVar8->TryCompileTimeout)->State;
    prefix._M_str = "LINK_LIBRARY_OVERRIDE_";
    prefix._M_len = 0x16;
    bVar3 = cmHasPrefix(str_00,prefix);
    if ((((bVar3) &&
         (cVar7 = cmGeneratorTarget::GetProperty(this->Target,(string *)pcVar8),
         cVar7.Value != (string *)0x0)) && ((cVar7.Value)->_M_string_length != 0)) &&
       ((cmState *)0x16 < ((cmStateSnapshot *)&pcVar8->TryCompileTimeout)->State)) {
      std::__cxx11::string::substr((ulong)&debugConfigs,(ulong)pcVar8);
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_158);
      pcVar2 = this->Target;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&overrideList,"LINK_LIBRARY_OVERRIDE",(allocator<char> *)&overrideFeature
                );
      cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
                (&dag,(cmListFileBacktrace *)local_158,pcVar2,(string *)&overrideList,
                 (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
      std::__cxx11::string::~string((string *)&overrideList);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 8));
      std::__cxx11::string::string((string *)&local_70,(string *)cVar7.Value);
      pcVar6 = cmGeneratorTarget::GetLocalGenerator(this->Target);
      cmGeneratorExpression::Evaluate
                (&overrideFeature,&local_70,pcVar6,config,this->Target,&dag,this->Target,
                 linkLanguage);
      std::__cxx11::string::~string((string *)&local_70);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::__cxx11::string&,std::__cxx11::string&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&this->LinkLibraryOverride,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&debugConfigs,
                 &overrideFeature);
      std::__cxx11::string::~string((string *)&overrideFeature);
      cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dag);
      std::__cxx11::string::~string((string *)&debugConfigs);
    }
  }
  pcVar2 = this->Target;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dag,"LINK_LIBRARY_OVERRIDE",(allocator<char> *)&debugConfigs);
  cVar7 = cmGeneratorTarget::GetProperty(pcVar2,(string *)&dag);
  std::__cxx11::string::~string((string *)&dag);
  if (cVar7.Value != (string *)0x0) {
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_188);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"LINK_LIBRARY_OVERRIDE",(allocator<char> *)&debugConfigs);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&dag,(cmListFileBacktrace *)local_188,target,&local_90,
               (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188 + 8));
    std::__cxx11::string::string((string *)&local_b0,(string *)cVar7.Value);
    pcVar6 = cmGeneratorTarget::GetLocalGenerator(target);
    cmGeneratorExpression::Evaluate
              ((string *)&debugConfigs,&local_b0,pcVar6,config,target,&dag,target,linkLanguage);
    std::__cxx11::string::~string((string *)&local_b0);
    str._M_str = (char *)debugConfigs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
    str._M_len = (size_t)debugConfigs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
    sep._M_str = ",";
    sep._M_len = 1;
    cmTokenize_abi_cxx11_(&overrideList,str,sep);
    __args = overrideList.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (0x20 < (ulong)((long)overrideList.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)overrideList.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      while (__args = __args + 1,
            __args != overrideList.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&this->LinkLibraryOverride,__args,
                   overrideList.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&overrideList);
    std::__cxx11::string::~string((string *)&debugConfigs);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dag);
  }
  bVar3 = config->_M_string_length == 0;
  this->HasConfig = !bVar3;
  if (bVar3) {
    dag.Parent = (cmGeneratorExpressionDAGChecker *)&dag.Property;
    dag.Target = (cmGeneratorTarget *)0x0;
    dag.Property._M_dataplus._M_p._0_1_ = 0;
  }
  else {
    std::__cxx11::string::string((string *)&dag,(string *)config);
  }
  std::__cxx11::string::_M_assign((string *)&this->Config);
  std::__cxx11::string::~string((string *)&dag);
  this_00 = cmMakefile::GetCMakeInstance(this->Makefile);
  cmake::GetDebugConfigs_abi_cxx11_(&debugConfigs,this_00);
  cVar4 = CMP0003_ComputeLinkType(&this->Config,&debugConfigs);
  this->LinkType = cVar4;
  pcVar5 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dag,"CMAKE_LINK_DEPENDS_DEBUG_MODE",(allocator<char> *)&overrideList);
  bVar3 = cmMakefile::IsOn(pcVar5,(string *)&dag);
  this->DebugMode = bVar3;
  std::__cxx11::string::~string((string *)&dag);
  this->OldLinkDirMode = false;
  std::__uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>::
  reset((__uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_> *)
        &this->CCG,(pointer)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&debugConfigs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_158 + 0x10));
  return;
}

Assistant:

cmComputeLinkDepends::cmComputeLinkDepends(const cmGeneratorTarget* target,
                                           const std::string& config,
                                           const std::string& linkLanguage)
{
  // Store context information.
  this->Target = target;
  this->Makefile = this->Target->Target->GetMakefile();
  this->GlobalGenerator =
    this->Target->GetLocalGenerator()->GetGlobalGenerator();
  this->CMakeInstance = this->GlobalGenerator->GetCMakeInstance();
  this->LinkLanguage = linkLanguage;

  // target oriented feature override property takes precedence over
  // global override property
  cm::string_view lloPrefix = "LINK_LIBRARY_OVERRIDE_"_s;
  auto const& keys = this->Target->GetPropertyKeys();
  std::for_each(
    keys.cbegin(), keys.cend(),
    [this, &lloPrefix, &config, &linkLanguage](std::string const& key) {
      if (cmHasPrefix(key, lloPrefix)) {
        if (cmValue feature = this->Target->GetProperty(key)) {
          if (!feature->empty() && key.length() > lloPrefix.length()) {
            auto item = key.substr(lloPrefix.length());
            cmGeneratorExpressionDAGChecker dag{ this->Target->GetBacktrace(),
                                                 this->Target,
                                                 "LINK_LIBRARY_OVERRIDE",
                                                 nullptr, nullptr };
            auto overrideFeature = cmGeneratorExpression::Evaluate(
              *feature, this->Target->GetLocalGenerator(), config,
              this->Target, &dag, this->Target, linkLanguage);
            this->LinkLibraryOverride.emplace(item, overrideFeature);
          }
        }
      }
    });
  // global override property
  if (cmValue linkLibraryOverride =
        this->Target->GetProperty("LINK_LIBRARY_OVERRIDE")) {
    cmGeneratorExpressionDAGChecker dag{ target->GetBacktrace(), target,
                                         "LINK_LIBRARY_OVERRIDE", nullptr,
                                         nullptr };
    auto overrideValue = cmGeneratorExpression::Evaluate(
      *linkLibraryOverride, target->GetLocalGenerator(), config, target, &dag,
      target, linkLanguage);

    auto overrideList = cmTokenize(overrideValue, ","_s);
    if (overrideList.size() >= 2) {
      auto const& feature = overrideList.front();
      for_each(overrideList.cbegin() + 1, overrideList.cend(),
               [this, &feature](std::string const& item) {
                 this->LinkLibraryOverride.emplace(item, feature);
               });
    }
  }

  // The configuration being linked.
  this->HasConfig = !config.empty();
  this->Config = (this->HasConfig) ? config : std::string();
  std::vector<std::string> debugConfigs =
    this->Makefile->GetCMakeInstance()->GetDebugConfigs();
  this->LinkType = CMP0003_ComputeLinkType(this->Config, debugConfigs);

  // Enable debug mode if requested.
  this->DebugMode = this->Makefile->IsOn("CMAKE_LINK_DEPENDS_DEBUG_MODE");

  // Assume no compatibility until set.
  this->OldLinkDirMode = false;

  // No computation has been done.
  this->CCG = nullptr;
}